

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecordSet.cpp
# Opt level: O3

void __thiscall KDIS::DATA_TYPE::RecordSet::~RecordSet(RecordSet *this)

{
  pointer puVar1;
  
  (this->super_DataTypeBase)._vptr_DataTypeBase = (_func_int **)&PTR__RecordSet_00226698;
  puVar1 = (this->m_vui8RecVals).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->m_vui8RecVals).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar1) {
    (this->m_vui8RecVals).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)(this->m_vui8RecVals).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar1);
  }
  DataTypeBase::~DataTypeBase(&this->super_DataTypeBase);
  return;
}

Assistant:

RecordSet::~RecordSet()
{
    m_vui8RecVals.clear();
}